

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__decode_jpeg_header(stbi__jpeg *z,int scan)

{
  stbi__uint32 b;
  uint uVar1;
  uint uVar2;
  stbi__context *s;
  stbi_uc sVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  stbi__uint32 sVar7;
  ulong uVar8;
  void *pvVar9;
  int extraout_EDX;
  int extraout_EDX_00;
  long lVar10;
  ulong uVar11;
  int iVar12;
  int *piVar13;
  uint uVar14;
  
  z->jfif = 0;
  z->app14_color_transform = -1;
  z->marker = 0xff;
  sVar3 = stbi__get_marker(z);
  if (sVar3 != 0xd8) {
    stbi__g_failure_reason = "no SOI";
    return 0;
  }
  if (scan == 1) {
    return 1;
  }
  bVar4 = stbi__get_marker(z);
  while ((bVar4 != 0xc2 && ((bVar4 & 0xfe) != 0xc0))) {
    iVar5 = stbi__process_marker(z,(uint)bVar4);
    if (iVar5 == 0) {
      return 0;
    }
    while (bVar4 = stbi__get_marker(z), bVar4 == 0xff) {
      iVar5 = stbi__at_eof(z->s);
      if (iVar5 != 0) {
        stbi__g_failure_reason = "no SOF";
        return 0;
      }
    }
  }
  z->progressive = (uint)(bVar4 == 0xc2);
  s = z->s;
  uVar6 = stbi__get16be(s);
  if (10 < uVar6) {
    sVar3 = stbi__get8(s);
    if (sVar3 != '\b') {
      stbi__g_failure_reason = "only 8-bit";
      return 0;
    }
    sVar7 = stbi__get16be(s);
    s->img_y = sVar7;
    if (sVar7 == 0) {
      stbi__g_failure_reason = "no header height";
      return 0;
    }
    sVar7 = stbi__get16be(s);
    s->img_x = sVar7;
    if (sVar7 == 0) {
      stbi__g_failure_reason = "0 width";
      return 0;
    }
    bVar4 = stbi__get8(s);
    if ((4 < bVar4) || ((0x1aU >> (bVar4 & 0x1f) & 1) == 0)) {
      stbi__g_failure_reason = "bad component count";
      return 0;
    }
    s->img_n = (uint)bVar4;
    for (lVar10 = 0; (ulong)bVar4 * 0x60 - lVar10 != 0; lVar10 = lVar10 + 0x60) {
      *(undefined8 *)((long)&z->img_comp[0].data + lVar10) = 0;
      *(undefined8 *)((long)&z->img_comp[0].linebuf + lVar10) = 0;
    }
    if (uVar6 == (uint)bVar4 + (uint)bVar4 * 2 + 8) {
      z->rgb = 0;
      piVar13 = &z->img_comp[0].tq;
      lVar10 = 0;
      while( true ) {
        uVar6 = s->img_n;
        uVar11 = (ulong)(int)uVar6;
        if ((long)uVar11 <= lVar10) break;
        bVar4 = stbi__get8(s);
        ((anon_struct_96_18_0d0905d3 *)(piVar13 + -3))->id = (uint)bVar4;
        if ((s->img_n == 3) && (bVar4 == (&stbi__process_frame_header_rgb)[lVar10])) {
          z->rgb = z->rgb + 1;
        }
        bVar4 = stbi__get8(s);
        piVar13[-2] = (uint)(bVar4 >> 4);
        if ((byte)(bVar4 + 0xb0) < 0xc0) {
          stbi__g_failure_reason = "bad H";
          return 0;
        }
        piVar13[-1] = bVar4 & 0xf;
        if ((bVar4 & 0xf) - 5 < 0xfffffffc) {
          stbi__g_failure_reason = "bad V";
          return 0;
        }
        bVar4 = stbi__get8(s);
        *piVar13 = (uint)bVar4;
        lVar10 = lVar10 + 1;
        piVar13 = piVar13 + 0x18;
        if (3 < bVar4) {
          stbi__g_failure_reason = "bad TQ";
          return 0;
        }
      }
      if (scan != 0) {
        return 1;
      }
      sVar7 = s->img_x;
      b = s->img_y;
      lVar10 = 0;
      iVar5 = stbi__mad3sizes_valid(sVar7,b,uVar6,0);
      if (iVar5 == 0) {
        stbi__g_failure_reason = "too large";
        return 0;
      }
      uVar8 = 0;
      if (0 < (int)uVar6) {
        uVar8 = (ulong)uVar6;
      }
      uVar6 = 1;
      uVar14 = 1;
      for (; uVar8 * 0x60 - lVar10 != 0; lVar10 = lVar10 + 0x60) {
        uVar1 = *(uint *)((long)&z->img_comp[0].h + lVar10);
        uVar2 = *(uint *)((long)&z->img_comp[0].v + lVar10);
        if ((int)uVar6 < (int)uVar1) {
          uVar6 = uVar1;
        }
        if ((int)uVar14 < (int)uVar2) {
          uVar14 = uVar2;
        }
      }
      z->img_h_max = uVar6;
      z->img_v_max = uVar14;
      z->img_mcu_w = uVar6 * 8;
      z->img_mcu_h = uVar14 * 8;
      lVar10 = 0;
      z->img_mcu_x = ((sVar7 + uVar6 * 8) - 1) / (uVar6 * 8);
      z->img_mcu_y = ((b + uVar14 * 8) - 1) / (uVar14 * 8);
      piVar13 = &z->img_comp[0].coeff_w;
      while( true ) {
        if ((int)uVar11 <= lVar10) {
          return 1;
        }
        piVar13[-0xf] = (s->img_x * piVar13[-0x15] + (uVar6 - 1)) / uVar6;
        piVar13[-0xe] = (s->img_y * piVar13[-0x14] + (uVar14 - 1)) / uVar14;
        iVar12 = piVar13[-0x15] * z->img_mcu_x * 8;
        piVar13[-0xd] = iVar12;
        iVar5 = piVar13[-0x14] * z->img_mcu_y * 8;
        piVar13[-0xc] = iVar5;
        *(undefined1 (*) [16])(piVar13 + -6) = (undefined1  [16])0x0;
        *(short **)(piVar13 + -2) = (short *)0x0;
        pvVar9 = stbi__malloc_mad2(iVar12,iVar5,0xf);
        *(void **)(piVar13 + -8) = pvVar9;
        iVar5 = extraout_EDX;
        if (pvVar9 == (void *)0x0) break;
        *(stbi_uc **)(piVar13 + -10) = (stbi_uc *)((long)pvVar9 + 0xfU & 0xfffffffffffffff0);
        if (z->progressive != 0) {
          iVar12 = (int)*(undefined8 *)(piVar13 + -0xd);
          iVar5 = (int)((ulong)*(undefined8 *)(piVar13 + -0xd) >> 0x20);
          *(ulong *)piVar13 =
               CONCAT44((int)(((uint)(iVar5 >> 0x1f) >> 0x1d) + iVar5) >> 3,
                        (int)(((uint)(iVar12 >> 0x1f) >> 0x1d) + iVar12) >> 3);
          pvVar9 = stbi__malloc_mad3(iVar12,iVar5,2,0xf);
          *(void **)(piVar13 + -6) = pvVar9;
          iVar5 = extraout_EDX_00;
          if (pvVar9 == (void *)0x0) break;
          *(short **)(piVar13 + -2) = (short *)((long)pvVar9 + 0xfU & 0xfffffffffffffff0);
        }
        lVar10 = lVar10 + 1;
        uVar11 = (ulong)(uint)s->img_n;
        piVar13 = piVar13 + 0x18;
      }
      stbi__g_failure_reason = "outofmem";
      stbi__free_jpeg_components(z,(int)lVar10 + 1,iVar5);
      return 0;
    }
  }
  stbi__g_failure_reason = "bad SOF len";
  return 0;
}

Assistant:

static int stbi__decode_jpeg_header(stbi__jpeg *z, int scan)
{
   int m;
   z->jfif = 0;
   z->app14_color_transform = -1; // valid values are 0,1,2
   z->marker = STBI__MARKER_none; // initialize cached marker to empty
   m = stbi__get_marker(z);
   if (!stbi__SOI(m)) return stbi__err("no SOI","Corrupt JPEG");
   if (scan == STBI__SCAN_type) return 1;
   m = stbi__get_marker(z);
   while (!stbi__SOF(m)) {
      if (!stbi__process_marker(z,m)) return 0;
      m = stbi__get_marker(z);
      while (m == STBI__MARKER_none) {
         // some files have extra padding after their blocks, so ok, we'll scan
         if (stbi__at_eof(z->s)) return stbi__err("no SOF", "Corrupt JPEG");
         m = stbi__get_marker(z);
      }
   }
   z->progressive = stbi__SOF_progressive(m);
   if (!stbi__process_frame_header(z, scan)) return 0;
   return 1;
}